

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1be8a27::AV1ConvolveXHighbdIntraBCTest_RunTest_Test::TestBody
          (AV1ConvolveXHighbdIntraBCTest_RunTest_Test *this)

{
  uint w;
  int h;
  int bd;
  ParamType *pPVar1;
  uint16_t *src;
  uint height;
  ConvolveParams conv_params2;
  ConvolveParams conv_params1;
  uint16_t reference [16384];
  uint16_t test [16384];
  ConvolveParams CStack_100c0;
  ConvolveParams CStack_10090;
  
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  w = (pPVar1->block_).width_;
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  h = (pPVar1->block_).height_;
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  bd = pPVar1->bd_;
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  src = AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>
        ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>
                         *)this,(this->super_AV1ConvolveXHighbdIntraBCTest).
                                super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>
                                .input16_1_,pPVar1);
  CStack_10090.is_compound = 0;
  CStack_10090.use_dist_wtd_comp_avg = 0;
  CStack_10090.round_0 = 3;
  CStack_10090.round_1 = 0xb;
  if (10 < bd) {
    CStack_10090.round_1 = 0x15 - bd;
    CStack_10090.round_0 = bd + -7;
  }
  CStack_10090.dst = (CONV_BUF_TYPE *)0x0;
  CStack_10090.dst_stride = 0;
  CStack_10090.plane = 0;
  CStack_10090.do_average = 0;
  av1_highbd_convolve_x_sr_intrabc_c
            (src,w + 2,(uint16_t *)&stack0xfffffffffffeffa0,0x80,w,h,&av1_intrabc_filter_params,8,
             &CStack_10090,bd);
  CStack_100c0.is_compound = 0;
  CStack_100c0.use_dist_wtd_comp_avg = 0;
  CStack_100c0.round_0 = 3;
  CStack_100c0.round_1 = 0xb;
  if (10 < bd) {
    CStack_100c0.round_1 = 0x15 - bd;
    CStack_100c0.round_0 = bd + -7;
  }
  CStack_100c0.dst = (CONV_BUF_TYPE *)0x0;
  CStack_100c0.dst_stride = 0;
  CStack_100c0.plane = 0;
  CStack_100c0.do_average = 0;
  pPVar1 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>_>
           ::GetParam();
  height = w;
  (*pPVar1->test_func_)
            (src,w + 2,(unsigned_short *)&stack0xffffffffffff7fa0,0x80,w,h,
             &av1_intrabc_filter_params,8,&CStack_100c0,bd);
  AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>
  ::AssertOutputBufferEq
            ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*,_int)>
              *)&stack0xfffffffffffeffa0,(uint16_t *)&stack0xffffffffffff7fa0,(uint16_t *)(ulong)w,h
             ,height);
  return;
}

Assistant:

TEST_P(AV1ConvolveXHighbdIntraBCTest, RunTest) { RunTest(); }